

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O2

void __thiscall
cppcms::impl::tcp_pipe::tcp_pipe
          (tcp_pipe *this,shared_ptr<cppcms::http::context> *connection,string *ip,int port)

{
  service *this_00;
  service *psVar1;
  
  (this->super_enable_shared_from_this<cppcms::impl::tcp_pipe>)._M_weak_this.
  super___weak_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cppcms::impl::tcp_pipe>)._M_weak_this.
  super___weak_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->connection_).
              super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>,
             &connection->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&this->ip_,(string *)ip);
  this->port_ = port;
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  (this->data_)._M_string_length = 0;
  (this->data_).field_2._M_local_buf[0] = '\0';
  this_00 = http::context::service
                      ((this->connection_).
                       super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  psVar1 = cppcms::service::impl(this_00);
  booster::aio::stream_socket::stream_socket
            (&this->socket_,
             (psVar1->io_service_)._M_t.
             super___uniq_ptr_impl<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>
             ._M_t.
             super__Tuple_impl<0UL,_booster::aio::io_service_*,_std::default_delete<booster::aio::io_service>_>
             .super__Head_base<0UL,_booster::aio::io_service_*,_false>._M_head_impl);
  (this->input_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->input_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->input_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

tcp_pipe(booster::shared_ptr<http::context> connection,std::string const &ip,int port) :
				connection_(connection),
				ip_(ip),
				port_(port),
				socket_(connection_->service().impl().get_io_service())
			{
			}